

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

QMatrix * Sub_QQ(QMatrix *Q1,QMatrix *Q2)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  ElType **ppEVar4;
  Boolean *pBVar5;
  QMatrixType *pQVar6;
  LASErrIdType LVar7;
  char *pcVar8;
  char *pcVar9;
  QMatrix *Q;
  size_t sVar10;
  size_t sVar11;
  char *Object2Name;
  
  Q_Lock(Q1);
  Q_Lock(Q2);
  LVar7 = LASResult();
  if (LVar7 == LASOK) {
    if (Q1->Dim == Q2->Dim) {
      if ((((Q1->Symmetry == Q2->Symmetry) && (Q1->ElOrder == Q2->ElOrder)) && (Q1->Len == Q2->Len))
         && (Q1->El == Q2->El)) {
        Q = (QMatrix *)malloc(0xb0);
        pcVar8 = Q_GetName(Q1);
        sVar10 = strlen(pcVar8);
        pcVar8 = Q_GetName(Q1);
        sVar11 = strlen(pcVar8);
        pcVar8 = (char *)malloc(sVar10 + sVar11 + 10);
        pcVar9 = Q_GetName(Q1);
        Object2Name = Q_GetName(Q2);
        if ((Q == (QMatrix *)0x0) || (pcVar8 == (char *)0x0)) {
          LASError(LASMemAllocErr,"Sub_QQ",pcVar9,Object2Name,(char *)0x0);
          if (Q != (QMatrix *)0x0) {
            free(Q);
          }
          if (pcVar8 == (char *)0x0) goto LAB_0010b5e5;
        }
        else {
          sprintf(pcVar8,"%s - %s",pcVar9,Object2Name);
          Q_Constr(Q,pcVar8,Q1->Dim,Q1->Symmetry,Q1->ElOrder,Tempor,False);
          LVar7 = LASResult();
          if (LVar7 == LASOK) {
            dVar2 = Q1->MultiplD - Q2->MultiplD;
            dVar3 = Q1->MultiplU - Q2->MultiplU;
            auVar1._8_4_ = SUB84(dVar3,0);
            auVar1._0_8_ = dVar2;
            auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
            Q->MultiplD = dVar2;
            Q->MultiplU = (double)auVar1._8_8_;
            Q->MultiplL = Q1->MultiplL - Q2->MultiplL;
            ppEVar4 = Q1->El;
            Q->Len = Q1->Len;
            Q->El = ppEVar4;
            pBVar5 = Q1->DiagElAlloc;
            Q->ElSorted = Q1->ElSorted;
            Q->DiagElAlloc = pBVar5;
            pBVar5 = Q1->ZeroInDiag;
            Q->DiagEl = Q1->DiagEl;
            Q->ZeroInDiag = pBVar5;
            Q->InvDiagEl = Q1->InvDiagEl;
            Q->UnitRightKer = Q1->UnitRightKer;
            Q->RightKerCmp = Q1->RightKerCmp;
            Q->UnitLeftKer = Q1->UnitLeftKer;
            Q->LeftKerCmp = Q1->LeftKerCmp;
            pQVar6 = Q1->ILU;
            Q->ILUExists = Q1->ILUExists;
            Q->ILU = pQVar6;
          }
        }
        free(pcVar8);
        goto LAB_0010b5e5;
      }
      pcVar8 = Q_GetName(Q1);
      pcVar9 = Q_GetName(Q2);
      LVar7 = LASMatrCombErr;
    }
    else {
      pcVar8 = Q_GetName(Q1);
      pcVar9 = Q_GetName(Q2);
      LVar7 = LASDimErr;
    }
    Q = (QMatrix *)0x0;
    LASError(LVar7,"Sub_QQ",pcVar8,pcVar9,(char *)0x0);
  }
  else {
    Q = (QMatrix *)0x0;
  }
LAB_0010b5e5:
  Q_Unlock(Q1);
  Q_Unlock(Q2);
  return Q;
}

Assistant:

QMatrix *Sub_QQ(QMatrix *Q1, QMatrix *Q2)
/* QRes = Q1 - Q2, this operation ist limited to matricies, which are
   derived from the same matrix */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q1);
    Q_Lock(Q2);
    
    if (LASResult() == LASOK) {
        if (Q1->Dim == Q2->Dim) {
            if (Q1->Symmetry == Q2->Symmetry &&
                Q1->ElOrder == Q2->ElOrder &&
                Q1->Len == Q2->Len &&
                Q1->El == Q2->El) {
                QRes = (QMatrix *)malloc(sizeof(QMatrix));
                QResName = (char *)malloc((strlen(Q_GetName(Q1)) + strlen(Q_GetName(Q1)) + 10)
                           * sizeof(char));
                if (QRes != NULL && QResName != NULL) {
                    sprintf(QResName, "%s - %s", Q_GetName(Q1), Q_GetName(Q2));
                    Q_Constr(QRes, QResName, Q1->Dim, Q1->Symmetry, Q1->ElOrder, Tempor, False);
                    if (LASResult() == LASOK) {
                        QRes->MultiplD = Q1->MultiplD - Q2->MultiplD;
                        QRes->MultiplU = Q1->MultiplU - Q2->MultiplU;
                        QRes->MultiplL = Q1->MultiplL - Q2->MultiplL;
                        QRes->Len = Q1->Len;
                        QRes->El = Q1->El;
                        QRes->ElSorted = Q1->ElSorted;
                        QRes->DiagElAlloc = Q1->DiagElAlloc;
                        QRes->DiagEl = Q1->DiagEl;
                        QRes->ZeroInDiag = Q1->ZeroInDiag;
                        QRes->InvDiagEl = Q1->InvDiagEl;
                        QRes->UnitRightKer = Q1->UnitRightKer;
                        QRes->RightKerCmp = Q1->RightKerCmp;
                        QRes->UnitLeftKer = Q1->UnitLeftKer;
                        QRes->LeftKerCmp = Q1->LeftKerCmp;
                        QRes->ILUExists = Q1->ILUExists;
                        QRes->ILU = Q1->ILU;
                    }
                } else {
                    LASError(LASMemAllocErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                    if (QRes != NULL)
                        free(QRes);
                }
            
                if (QResName != NULL)
                    free(QResName);
            } else {
                LASError(LASMatrCombErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                QRes = NULL;
            }
        } else {
            LASError(LASDimErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
            QRes = NULL;
        }
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q1);
    Q_Unlock(Q2);

    return(QRes);
}